

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseAssignment(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynModifyAssignType type;
  SynAssignment *lhs;
  SynBase *pSVar2;
  undefined4 extraout_var;
  SynAssignment *this;
  Lexeme *pLVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  InplaceStr IVar4;
  undefined4 extraout_var_00;
  
  lhs = (SynAssignment *)ParseTernaryExpr(ctx);
  if (lhs == (SynAssignment *)0x0) {
    this = (SynAssignment *)0x0;
  }
  else {
    begin = ctx->currentLexeme;
    if (begin->type == lex_set) {
      ctx->currentLexeme = begin + 1;
      pSVar2 = ParseAssignment(ctx);
      if (pSVar2 == (SynBase *)0x0) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar2 = (SynBase *)CONCAT44(extraout_var,iVar1);
        SynError::SynError((SynError *)pSVar2,ctx->currentLexeme,ctx->currentLexeme);
      }
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynAssignment *)CONCAT44(extraout_var_00,iVar1);
      pLVar3 = ParseContext::Previous(ctx);
      SynAssignment::SynAssignment(this,begin,pLVar3,(SynBase *)lhs,pSVar2);
    }
    else {
      type = GetModifyAssignType(begin->type);
      this = lhs;
      if (type != SYN_MODIFY_ASSIGN_UNKNOWN) {
        IVar4 = ParseContext::Consume(ctx);
        pSVar2 = ParseAssignment(ctx);
        if (pSVar2 == (SynBase *)0x0) {
          anon_unknown.dwarf_147a9::Report
                    (ctx,ctx->currentLexeme,"ERROR: expression not found after \'%.*s\' operator",
                     (ulong)(uint)((int)IVar4.end - (int)IVar4.begin));
          iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pSVar2 = (SynBase *)CONCAT44(extraout_var_01,iVar1);
          SynError::SynError((SynError *)pSVar2,ctx->currentLexeme,ctx->currentLexeme);
        }
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        this = (SynAssignment *)CONCAT44(extraout_var_02,iVar1);
        pLVar3 = ParseContext::Previous(ctx);
        SynModifyAssignment::SynModifyAssignment
                  ((SynModifyAssignment *)this,begin,pLVar3,type,(SynBase *)lhs,pSVar2);
      }
    }
  }
  return &this->super_SynBase;
}

Assistant:

SynBase* ParseAssignment(ParseContext &ctx)
{
	if(SynBase *lhs = ParseTernaryExpr(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_set))
		{
			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynAssignment>()) SynAssignment(pos, ctx.Previous(), lhs, rhs);
		}
		else if(SynModifyAssignType modifyType = GetModifyAssignType(ctx.Peek()))
		{
			InplaceStr name = ctx.Consume();

			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s' operator", name.length(), name.begin);

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynModifyAssignment>()) SynModifyAssignment(pos, ctx.Previous(), modifyType, lhs, rhs);
		}

		return lhs;
	}

	return NULL;
}